

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::Brick_ForceNumerical::Brick_ForceNumerical
          (Brick_ForceNumerical *this,ChMatrixNM<double,_8,_3> *d_,ChMatrixNM<double,_8,_3> *d0_,
          ChElementHexaANCF_3813 *element_,ChMatrixNM<double,_6,_6> *T0_,double *detJ0C_,
          ChVectorN<double,_9> *alpha_eas_)

{
  (this->super_ChIntegrable3D<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>)._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_00b35808;
  this->element = element_;
  this->d = d_;
  this->d0 = d0_;
  this->T0 = T0_;
  this->alpha_eas = alpha_eas_;
  this->detJ0C = detJ0C_;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [4] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [8] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [9] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  (this->E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  memset(&this->Sx,0,0x6c0);
  return;
}

Assistant:

Brick_ForceNumerical::Brick_ForceNumerical(ChMatrixNM<double, 8, 3>* d_,
                                           ChMatrixNM<double, 8, 3>* d0_,
                                           ChElementHexaANCF_3813* element_,
                                           ChMatrixNM<double, 6, 6>* T0_,
                                           double* detJ0C_,
                                           ChVectorN<double, 9>* alpha_eas_)
    : element(element_), d(d_), d0(d0_), T0(T0_), alpha_eas(alpha_eas_), detJ0C(detJ0C_) {
    E_eps.setZero();

    Sx.setZero();
    Sy.setZero();
    Sz.setZero();
}